

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O1

bool __thiscall
glslang::TIntermediate::isIntegralPromotion(TIntermediate *this,TBasicType from,TBasicType to)

{
  return (from & ~EbtFloat16) == EbtInt8 && to == EbtInt;
}

Assistant:

bool TIntermediate::isIntegralPromotion(TBasicType from, TBasicType to) const
{
    // integral promotions
    if (to == EbtInt) {
        switch(from) {
        case EbtInt8:
        case EbtInt16:
        case EbtUint8:
        case EbtUint16:
            return true;
        default:
            break;
        }
    }
    return false;
}